

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O2

void test_resampler_duplex<float>
               (uint32_t input_channels,uint32_t output_channels,uint32_t input_rate,
               uint32_t output_rate,uint32_t target_rate,float chunk_duration)

{
  uint32_t uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  auto_array<float> local_128;
  cubeb_resampler *local_110;
  long input_consumed;
  ulong local_100;
  long local_f8;
  auto_array<float> expected_resampled_output;
  auto_array<float> expected_resampled_input;
  auto_array<float> output_buffer;
  osc_state state;
  cubeb_stream_params output_params;
  cubeb_stream_params input_params;
  
  state.input_phase_index = 0;
  state.output_phase_index = 0;
  state.output_offset = 0;
  state.input.data_ = (float *)0x0;
  state.input.capacity_ = 0;
  state.input.length_ = 0;
  state.output.data_ = (float *)0x0;
  state.output.capacity_ = 0;
  state.output.length_ = 0;
  output_params.format = CUBEB_SAMPLE_FLOAT32LE;
  output_params.prefs = CUBEB_STREAM_PREF_NONE;
  input_params.prefs = CUBEB_STREAM_PREF_NONE;
  state.input_channels = input_channels;
  state.output_channels = output_channels;
  state.output_rate = output_rate;
  state.target_rate = target_rate;
  output_params.rate = output_rate;
  output_params.channels = output_channels;
  input_params.format = output_params.format;
  input_params.rate = input_rate;
  input_params.channels = input_channels;
  local_110 = cubeb_resampler_create
                        ((cubeb_stream *)0x0,&input_params,&output_params,target_rate,
                         data_cb_resampler,&state,CUBEB_RESAMPLER_QUALITY_VOIP,
                         CUBEB_RESAMPLER_RECLOCK_NONE);
  local_f8 = cubeb_resampler_latency(local_110);
  uVar1 = target_rate * 2;
  local_100 = (ulong)target_rate;
  fVar9 = ceilf(((float)input_rate * chunk_duration) / 1000.0);
  fVar10 = ceilf((float)input_rate / (float)target_rate);
  uVar3 = (ulong)(fVar10 + fVar10 + fVar9);
  uVar5 = (ulong)(((float)output_rate * chunk_duration) / 1000.0);
  iVar6 = (int)uVar3;
  auto_array<float>::auto_array(&local_128,iVar6 * input_channels);
  auto_array<float>::auto_array(&output_buffer,(int)uVar5 * output_channels);
  auto_array<float>::auto_array(&expected_resampled_input,uVar1 * input_channels);
  uVar7 = output_channels * output_rate * 2;
  auto_array<float>::auto_array(&expected_resampled_output,uVar7);
  state.max_output_phase_index = uVar1;
  auto_array<float>::push_silence(&expected_resampled_input,(ulong)(uVar1 * input_channels));
  auto_array<float>::push_silence(&expected_resampled_output,(ulong)uVar7);
  lVar4 = local_f8;
  iVar2 = (int)local_f8;
  fill_with_sine(expected_resampled_input.data_ + local_f8,(uint32_t)local_100,input_channels,
                 uVar1 - iVar2,0);
  fill_with_sine(expected_resampled_output.data_ + lVar4,output_rate,output_channels,
                 output_rate * 2 - iVar2,0);
  uVar3 = uVar3 & 0xffffffff;
  while (state.output_phase_index != state.max_output_phase_index) {
    uVar7 = (int)local_128.length_ * input_channels;
    auto_array<float>::reserve(&local_128,uVar3);
    state.input_phase_index =
         fill_with_sine(local_128.data_ + uVar7,input_rate,input_channels,iVar6 - uVar7,
                        state.input_phase_index);
    local_128.length_ = uVar3;
    input_consumed = uVar3;
    lVar4 = cubeb_resampler_fill
                      (local_110,local_128.data_,&input_consumed,output_buffer.data_,
                       uVar5 & 0xffffffff);
    if (iVar6 == (int)input_consumed) {
      local_128.length_ = 0;
    }
    else {
      uVar8 = input_consumed * (ulong)input_channels;
      if (uVar8 <= local_128.length_) {
        memmove(local_128.data_,local_128.data_ + uVar8,(local_128.length_ - uVar8) * 4);
        local_128.length_ = local_128.length_ - uVar8;
      }
    }
    auto_array<float>::push(&state.output,output_buffer.data_,lVar4 * (ulong)state.output_channels);
  }
  dump<float>("input_expected.raw",expected_resampled_input.data_,expected_resampled_input.length_);
  dump<float>("output_expected.raw",expected_resampled_output.data_,
              expected_resampled_output.length_);
  dump<float>("input.raw",state.input.data_,state.input.length_);
  dump<float>("output.raw",state.output.data_,state.output.length_);
  cubeb_resampler_destroy(local_110);
  auto_array<float>::~auto_array(&expected_resampled_output);
  auto_array<float>::~auto_array(&expected_resampled_input);
  auto_array<float>::~auto_array(&output_buffer);
  auto_array<float>::~auto_array(&local_128);
  osc_state::~osc_state(&state);
  return;
}

Assistant:

void test_resampler_duplex(uint32_t input_channels, uint32_t output_channels,
                           uint32_t input_rate, uint32_t output_rate,
                           uint32_t target_rate, float chunk_duration)
{
  cubeb_stream_params input_params;
  cubeb_stream_params output_params;
  osc_state state;

  input_params.format = output_params.format = cubeb_format<T>();
  state.input_channels = input_params.channels = input_channels;
  state.output_channels = output_params.channels = output_channels;
  input_params.rate = input_rate;
  state.output_rate = output_params.rate = output_rate;
  state.target_rate = target_rate;
  input_params.prefs = output_params.prefs = CUBEB_STREAM_PREF_NONE;
  long got;

  cubeb_resampler * resampler =
    cubeb_resampler_create((cubeb_stream*)nullptr, &input_params, &output_params, target_rate,
                           data_cb_resampler, (void*)&state, CUBEB_RESAMPLER_QUALITY_VOIP,
                           CUBEB_RESAMPLER_RECLOCK_NONE);

  long latency = cubeb_resampler_latency(resampler);

  const uint32_t duration_s = 2;
  int32_t duration_frames = duration_s * target_rate;
  uint32_t input_array_frame_count = ceil(chunk_duration * input_rate / 1000) + ceilf(static_cast<float>(input_rate) / target_rate) * 2;
  uint32_t output_array_frame_count = chunk_duration * output_rate / 1000;
  auto_array<float> input_buffer(input_channels * input_array_frame_count);
  auto_array<float> output_buffer(output_channels * output_array_frame_count);
  auto_array<float> expected_resampled_input(input_channels * duration_frames);
  auto_array<float> expected_resampled_output(output_channels * output_rate * duration_s);

  state.max_output_phase_index = duration_s * target_rate;

  expected_resampled_input.push_silence(input_channels * duration_frames);
  expected_resampled_output.push_silence(output_channels * output_rate * duration_s);

  /* expected output is a 440Hz sine wave at 16kHz */
  fill_with_sine(expected_resampled_input.data() + latency,
                 target_rate, input_channels, duration_frames - latency, 0);
  /* expected output is a 440Hz sine wave at 32kHz */
  fill_with_sine(expected_resampled_output.data() + latency,
                 output_rate, output_channels, output_rate * duration_s - latency, 0);

  while (state.output_phase_index != state.max_output_phase_index) {
    uint32_t leftover_samples = input_buffer.length() * input_channels;
    input_buffer.reserve(input_array_frame_count);
    state.input_phase_index = fill_with_sine(input_buffer.data() + leftover_samples,
                                             input_rate,
                                             input_channels,
                                             input_array_frame_count - leftover_samples,
                                             state.input_phase_index);
    long input_consumed = input_array_frame_count;
    input_buffer.set_length(input_array_frame_count);

    got = cubeb_resampler_fill(resampler,
                               input_buffer.data(), &input_consumed,
                               output_buffer.data(), output_array_frame_count);

    /* handle leftover input */
    if (input_array_frame_count != static_cast<uint32_t>(input_consumed)) {
      input_buffer.pop(nullptr, input_consumed * input_channels);
    } else {
      input_buffer.clear();
    }

    state.output.push(output_buffer.data(), got * state.output_channels);
  }

  dump("input_expected.raw", expected_resampled_input.data(), expected_resampled_input.length());
  dump("output_expected.raw", expected_resampled_output.data(), expected_resampled_output.length());
  dump("input.raw", state.input.data(), state.input.length());
  dump("output.raw", state.output.data(), state.output.length());

 // This is disabled because the latency estimation in the resampler code is
 // slightly off so we can generate expected vectors.
 // See https://github.com/kinetiknz/cubeb/issues/93
 // ASSERT_TRUE(array_fuzzy_equal(state.input, expected_resampled_input, epsilon<T>(input_rate/target_rate)));
 // ASSERT_TRUE(array_fuzzy_equal(state.output, expected_resampled_output, epsilon<T>(output_rate/target_rate)));

  cubeb_resampler_destroy(resampler);
}